

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

void anon_unknown.dwarf_14272::_scale
               (uint32_t *Target,int TgtWidth,int TgtHeight,uint32_t *Source,int SrcWidth,
               int SrcHeight)

{
  uint32_t *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint32_t *puVar8;
  
  lVar4 = (long)TgtWidth;
  iVar5 = 0;
  puVar1 = (uint32_t *)0x0;
  iVar3 = TgtHeight;
  while (0 < iVar3) {
    if (Source == puVar1) {
      memcpy(Target,Target + -lVar4,lVar4 * 4);
    }
    else {
      iVar2 = 0;
      puVar1 = Source;
      puVar8 = Target;
      iVar6 = TgtWidth;
      while (0 < iVar6) {
        iVar6 = iVar6 + -1;
        *puVar8 = *puVar1;
        puVar8 = puVar8 + 1;
        iVar2 = iVar2 + SrcWidth % TgtWidth;
        puVar1 = puVar1 + (long)(SrcWidth / TgtWidth) + (ulong)(TgtWidth <= iVar2);
        iVar7 = TgtWidth;
        if (iVar2 < TgtWidth) {
          iVar7 = 0;
        }
        iVar2 = iVar2 - iVar7;
      }
    }
    iVar3 = iVar3 + -1;
    Target = Target + lVar4;
    iVar5 = iVar5 + SrcHeight % TgtHeight;
    iVar6 = SrcWidth;
    if (iVar5 < TgtHeight) {
      iVar6 = 0;
    }
    iVar2 = TgtHeight;
    if (iVar5 < TgtHeight) {
      iVar2 = 0;
    }
    iVar5 = iVar5 - iVar2;
    puVar1 = Source;
    Source = Source + (long)((SrcHeight / TgtHeight) * SrcWidth) + (long)iVar6;
  }
  return;
}

Assistant:

void _scale(uint32_t* Target, int TgtWidth, int TgtHeight, const uint32_t* Source, int SrcWidth, int SrcHeight)
    {    
    // image scaling with Bresenham, Thiadmer Riemersma, Dr.Dobb's.    
    int NumPixels = TgtHeight;
    int IntPart = (SrcHeight / TgtHeight) * SrcWidth;
    int FractPart = SrcHeight % TgtHeight;
    int E = 0;
    const uint32_t* PrevSource = nullptr;
    while (NumPixels-- > 0)
      {
      
      if (Source == PrevSource)
        {
        memcpy(Target, Target-TgtWidth, TgtWidth*sizeof(uint32_t));
        }
      else
        {
        _scale_line(Target, Source, SrcWidth, TgtWidth);
        PrevSource = Source;
        }
      
      Target += TgtWidth;
      Source += IntPart;
      E += FractPart;
      if (E >= TgtHeight)
        {
        E -= TgtHeight;
        Source += SrcWidth;
        }        
      }
    }